

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiArea::childEvent(QMdiArea *this,QChildEvent *childEvent)

{
  long lVar1;
  Type TVar2;
  QMdiAreaPrivate *t;
  QMdiSubWindow *pQVar3;
  qsizetype qVar4;
  QEvent *in_RSI;
  long in_FS_OFFSET;
  QMdiAreaPrivate *d;
  QMdiSubWindow *mdiChild;
  QMdiSubWindow *in_stack_00000048;
  QMdiAreaPrivate *in_stack_00000050;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  t = d_func((QMdiArea *)0x6142ca);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == ChildPolished) {
    QChildEvent::child((QChildEvent *)in_RSI);
    pQVar3 = qobject_cast<QMdiSubWindow*>((QObject *)0x6142ef);
    if ((pQVar3 != (QMdiSubWindow *)0x0) &&
       (qVar4 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QMdiSubWindow*>
                          ((QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *)in_RSI,
                           (QMdiSubWindow **)t,0x614315), qVar4 == -1)) {
      QMdiAreaPrivate::appendChild(in_stack_00000050,in_stack_00000048);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiArea::childEvent(QChildEvent *childEvent)
{
    Q_D(QMdiArea);
    if (childEvent->type() == QEvent::ChildPolished) {
        if (QMdiSubWindow *mdiChild = qobject_cast<QMdiSubWindow *>(childEvent->child())) {
            if (d->childWindows.indexOf(mdiChild) == -1)
                d->appendChild(mdiChild);
        }
    }
}